

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__input____input_local_offset_type
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  bool bVar1;
  ParserTemplateBase *this_00;
  SaxParser *pSVar2;
  uint64 uVar3;
  long *in_RSI;
  ParserChar *in_RDI;
  bool failed_1;
  bool failed;
  ParserChar *attributeValue;
  StringHash hash;
  ParserChar *attribute;
  ParserChar **attributeArray;
  input____input_local_offset_type__AttributeData *attributeData;
  ParserChar *in_stack_00000088;
  ParserChar *in_stack_00000090;
  StringHash in_stack_00000098;
  ErrorType in_stack_000000a0;
  Severity in_stack_000000a4;
  ParserTemplateBase *in_stack_000000a8;
  undefined6 in_stack_ffffffffffffffa8;
  byte in_stack_ffffffffffffffae;
  byte in_stack_ffffffffffffffaf;
  ParserTemplateBase *in_stack_ffffffffffffffb0;
  StringHash in_stack_ffffffffffffffb8;
  StringHash in_stack_ffffffffffffffc0;
  ParserChar *text;
  undefined8 *puVar4;
  bool local_1;
  
  this_00 = (ParserTemplateBase *)
            GeneratedSaxParser::ParserTemplateBase::
            newData<COLLADASaxFWL15::input____input_local_offset_type__AttributeData>
                      (in_stack_ffffffffffffffb0,
                       (void **)CONCAT17(in_stack_ffffffffffffffaf,
                                         CONCAT16(in_stack_ffffffffffffffae,
                                                  in_stack_ffffffffffffffa8)));
  puVar4 = (undefined8 *)*in_RSI;
  if (puVar4 == (undefined8 *)0x0) {
LAB_009c2aca:
    if ((((ulong)(this_00->super_Parser)._vptr_Parser & 1) == 0) &&
       (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                          (this_00,(Severity)((ulong)puVar4 >> 0x20),(ErrorType)puVar4,
                           in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                           (ParserChar *)in_stack_ffffffffffffffb0), bVar1)) {
      local_1 = false;
    }
    else if (((this_00->super_Parser).mErrorHandler == (IErrorHandler *)0x0) &&
            (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                               (this_00,(Severity)((ulong)puVar4 >> 0x20),(ErrorType)puVar4,
                                in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                                (ParserChar *)in_stack_ffffffffffffffb0), bVar1)) {
      local_1 = false;
    }
    else if (((this_00->mElementDataStack).
              super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
              ._M_impl.super__Deque_impl_data._M_map == (_Map_pointer)0x0) &&
            (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                               (this_00,(Severity)((ulong)puVar4 >> 0x20),(ErrorType)puVar4,
                                in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                                (ParserChar *)in_stack_ffffffffffffffb0), bVar1)) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    do {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              text = (ParserChar *)*puVar4;
              if (text == (ParserChar *)0x0) {
                in_stack_ffffffffffffffc0 = 0;
                goto LAB_009c2aca;
              }
              in_stack_ffffffffffffffb8 = GeneratedSaxParser::Utils::calculateStringHash(text);
              if (puVar4 + 1 == (undefined8 *)0x0) {
                return false;
              }
              in_stack_ffffffffffffffb0 = (ParserTemplateBase *)puVar4[1];
              puVar4 = puVar4 + 2;
              if (in_stack_ffffffffffffffb8 != 0x79c4) break;
              uVar3 = GeneratedSaxParser::Utils::toUint64(in_RDI,(bool *)0x79c4);
              (this_00->mElementDataStack).
              super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
              ._M_impl.super__Deque_impl_data._M_map_size = uVar3;
              if (((in_stack_ffffffffffffffae & 1) != 0) &&
                 (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                                    (this_00,(Severity)((ulong)puVar4 >> 0x20),(ErrorType)puVar4,
                                     (StringHash)text,in_stack_ffffffffffffffb8,
                                     (ParserChar *)in_stack_ffffffffffffffb0), bVar1)) {
                return false;
              }
              if ((in_stack_ffffffffffffffae & 1) == 0) {
                *(uint *)&(this_00->super_Parser)._vptr_Parser =
                     *(uint *)&(this_00->super_Parser)._vptr_Parser | 2;
              }
            }
            if (in_stack_ffffffffffffffb8 != 0x75cd9c4) break;
            pSVar2 = (SaxParser *)GeneratedSaxParser::Utils::toUint64(in_RDI,(bool *)0x75cd9c4);
            (this_00->super_Parser).mSaxParser = pSVar2;
            if (((in_stack_ffffffffffffffaf & 1) != 0) &&
               (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                                  (this_00,(Severity)((ulong)puVar4 >> 0x20),(ErrorType)puVar4,
                                   (StringHash)text,in_stack_ffffffffffffffb8,
                                   (ParserChar *)in_stack_ffffffffffffffb0), bVar1)) {
              return false;
            }
            if ((in_stack_ffffffffffffffaf & 1) == 0) {
              *(uint *)&(this_00->super_Parser)._vptr_Parser =
                   *(uint *)&(this_00->super_Parser)._vptr_Parser | 1;
            }
          }
          if (in_stack_ffffffffffffffb8 != 0x7a6c895) break;
          (this_00->mElementDataStack).
          super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
          ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)in_stack_ffffffffffffffb0;
        }
        if (in_stack_ffffffffffffffb8 != 0xc385d63) break;
        (this_00->super_Parser).mErrorHandler = (IErrorHandler *)in_stack_ffffffffffffffb0;
      }
      bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                        (in_stack_000000a8,in_stack_000000a4,in_stack_000000a0,in_stack_00000098,
                         in_stack_00000090,in_stack_00000088);
    } while (!bVar1);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__input____input_local_offset_type( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__input____input_local_offset_type( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

input____input_local_offset_type__AttributeData* attributeData = newData<input____input_local_offset_type__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_OFFSET:
    {
bool failed;
attributeData->offset = GeneratedSaxParser::Utils::toUint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_INPUT,
        HASH_ATTRIBUTE_OFFSET,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= input____input_local_offset_type__AttributeData::ATTRIBUTE_OFFSET_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_SEMANTIC:
    {

attributeData->semantic = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NMTOKEN(attributeData->semantic, strlen(attributeData->semantic));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_INPUT,
            HASH_ATTRIBUTE_SEMANTIC,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    case HASH_ATTRIBUTE_SOURCE:
    {

attributeData->source = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__urifragment_type(attributeData->source, strlen(attributeData->source));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_INPUT,
            HASH_ATTRIBUTE_SOURCE,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    case HASH_ATTRIBUTE_SET:
    {
bool failed;
attributeData->set = GeneratedSaxParser::Utils::toUint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_INPUT,
        HASH_ATTRIBUTE_SET,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= input____input_local_offset_type__AttributeData::ATTRIBUTE_SET_PRESENT;

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_INPUT, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ( (attributeData->present_attributes & input____input_local_offset_type__AttributeData::ATTRIBUTE_OFFSET_PRESENT) == 0 )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_INPUT, HASH_ATTRIBUTE_OFFSET, 0 ) )
        return false;
}
if ( !attributeData->semantic )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_INPUT, HASH_ATTRIBUTE_SEMANTIC, 0 ) )
        return false;
}
if ( !attributeData->source )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_INPUT, HASH_ATTRIBUTE_SOURCE, 0 ) )
        return false;
}


    return true;
}